

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O3

void ZydisReEncodeInstruction
               (ZydisDecoder *decoder,ZydisDecodedInstruction *insn1,ZydisDecodedOperand *operands1,
               ZyanU8 operand_count,ZyanU8 *insn1_bytes)

{
  bool bVar1;
  ZyanStatus ZVar2;
  int iVar3;
  ulong uVar4;
  ZyanU64 ZVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ZydisDecodedOperand *operand;
  ulong uVar10;
  ZyanU8 encoded_instruction [15];
  ZyanUSize encoded_length;
  ZyanU8 insn1_bytes_1 [15];
  ZydisDecodedInstruction insn2;
  ZydisEncoderRequest request;
  ZydisDecodedOperand operands2 [10];
  ZyanU8 local_64f [15];
  ZyanUSize local_640;
  ZyanUSize local_638;
  undefined1 local_62f [15];
  ZydisDecodedInstruction local_620;
  ZydisEncoderRequest local_4d8;
  ZydisDecodedOperand local_348 [10];
  
  ZydisPrintInstruction(insn1,operands1,operand_count,insn1_bytes);
  ZydisValidateEnumRanges(insn1,operands1,operand_count);
  if (operand_count < insn1->operand_count_visible) {
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  ZVar2 = ZydisEncoderDecodedInstructionToEncoderRequest
                    (insn1,operands1,insn1->operand_count_visible,&local_4d8);
  if ((int)ZVar2 < 0) {
    ZydisReEncodeInstruction_cold_1();
LAB_0010f417:
    ZydisReEncodeInstruction_cold_2();
LAB_0010f41c:
    ZydisReEncodeInstruction_cold_3();
  }
  else {
    local_640 = 0xf;
    ZVar2 = ZydisEncoderEncodeInstruction(&local_4d8,local_64f,&local_640);
    if ((int)ZVar2 < 0) goto LAB_0010f417;
    ZVar2 = ZydisDecoderDecodeFull(decoder,local_64f,local_640,&local_620,local_348);
    if ((int)ZVar2 < 0) goto LAB_0010f41c;
    ZydisPrintInstruction(&local_620,local_348,local_620.operand_count_visible,local_64f);
    ZydisValidateEnumRanges(&local_620,local_348,local_620.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1,operands1,&local_620,local_348);
    uVar4 = (ulong)local_620.length;
    if (local_620.length <= insn1->length) {
      lVar6 = 0x8000;
      if (local_620.address_width == '\x10') {
LAB_0010f2ca:
        lVar9 = 0x8000;
        if (local_620.operand_width != '\x10') {
          lVar9 = lVar6;
        }
        if (local_620.machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
          lVar9 = lVar6;
        }
        uVar7 = (ulong)local_4d8.operand_count;
        if (local_4d8.operand_count == 0) {
          return;
        }
        bVar1 = true;
        uVar10 = 0;
LAB_0010f2f8:
        uVar8 = uVar10 << 6 | 0x30;
        operand = local_348 + uVar10;
        do {
          iVar3 = *(int *)((long)local_4d8.operands + (uVar8 - 0x30));
          if (iVar3 == 2) {
            if (((operand->field_10).mem.base & ~ZYDIS_REGISTER_AL) == ZYDIS_REGISTER_EIP) {
              lVar6 = 0x20;
              goto LAB_0010f35d;
            }
          }
          else if ((iVar3 == 4) && ((operand->field_10).imm.is_relative != '\0')) goto LAB_0010f358;
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 0x40;
          operand = operand + 1;
          if (uVar7 <= uVar10) {
            if (bVar1) {
              return;
            }
            goto LAB_0010f398;
          }
        } while( true );
      }
      if (local_620.address_width == '@') {
        lVar6 = -0x8000000000000000;
        goto LAB_0010f2ca;
      }
      if (local_620.address_width == ' ') {
        lVar6 = 0x80000000;
        goto LAB_0010f2ca;
      }
      goto LAB_0010f430;
    }
  }
  ZydisReEncodeInstruction_cold_7();
  goto LAB_0010f426;
LAB_0010f358:
  lVar6 = 0x38;
LAB_0010f35d:
  ZVar2 = ZydisCalcAbsoluteAddress
                    (&local_620,operand,lVar9 - uVar4,
                     (ZyanU64 *)((long)local_4d8.operands + uVar8 + lVar6 + -0x30));
  if ((int)ZVar2 < 0) goto LAB_0010f42b;
  uVar7 = (ulong)local_4d8.operand_count;
  uVar10 = uVar10 + 1;
  bVar1 = false;
  if (uVar7 <= uVar10) goto LAB_0010f398;
  goto LAB_0010f2f8;
LAB_0010f398:
  local_638 = 0xf;
  ZVar2 = ZydisEncoderEncodeInstructionAbsolute(&local_4d8,local_62f,&local_638,lVar9 - uVar4);
  if ((int)ZVar2 < 0) {
    ZydisReEncodeInstruction_cold_5();
    ZVar5 = ZydisGetVersion();
    if (ZVar5 != 0x4000000000000) {
      ZydisFuzzerInit_cold_1();
    }
    return;
  }
  if ((local_638 == local_620.length) && (iVar3 = bcmp(local_62f,local_64f,local_638), iVar3 == 0))
  {
    return;
  }
LAB_0010f426:
  ZydisReEncodeInstruction_cold_6();
LAB_0010f42b:
  ZydisReEncodeInstruction_cold_4();
LAB_0010f430:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                ,0x196,
                "void ZydisReEncodeInstructionAbsolute(ZydisEncoderRequest *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, const ZyanU8 *)"
               );
}

Assistant:

void ZydisReEncodeInstruction(const ZydisDecoder *decoder, const ZydisDecodedInstruction *insn1,
    const ZydisDecodedOperand* operands1, ZyanU8 operand_count, const ZyanU8 *insn1_bytes)
{
    ZydisPrintInstruction(insn1, operands1, operand_count, insn1_bytes);
    ZydisValidateEnumRanges(insn1, operands1, operand_count);

    ZYAN_ASSERT(operand_count >= insn1->operand_count_visible);

    ZydisEncoderRequest request;
    ZyanStatus status = ZydisEncoderDecodedInstructionToEncoderRequest(insn1, operands1,
        insn1->operand_count_visible, &request);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("ZydisEncoderDecodedInstructionToEncoderRequest failed\n", ZYAN_STDERR);
        abort();
    }

    ZyanU8 encoded_instruction[ZYDIS_MAX_INSTRUCTION_LENGTH];
    ZyanUSize encoded_length = sizeof(encoded_instruction);
    status = ZydisEncoderEncodeInstruction(&request, encoded_instruction, &encoded_length);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to re-encode instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisDecodedInstruction insn2;
    ZydisDecodedOperand operands2[ZYDIS_MAX_OPERAND_COUNT];
    status = ZydisDecoderDecodeFull(decoder, encoded_instruction, encoded_length, &insn2,
        operands2);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to decode re-encoded instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisPrintInstruction(&insn2, operands2, insn2.operand_count_visible, encoded_instruction);
    ZydisValidateEnumRanges(&insn2, operands2, insn2.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1, operands1, &insn2, operands2);

    if (insn2.length > insn1->length)
    {
        fputs("Suboptimal output size detected\n", ZYAN_STDERR);
        abort();
    }

    ZydisReEncodeInstructionAbsolute(&request, &insn2, operands2, encoded_instruction);
}